

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

void Abc_FrameReplacePoEquivs(Abc_Frame_t *pAbc,Vec_Ptr_t **pvPoEquivs)

{
  Vec_Ptr_t *p;
  int i;
  long lVar1;
  
  p = pAbc->vPoEquivs;
  if (p != (Vec_Ptr_t *)0x0) {
    for (lVar1 = 0; lVar1 < p->nSize; lVar1 = lVar1 + 1) {
      if ((Vec_Ptr_t *)p->pArray[lVar1] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)p->pArray[lVar1]);
      }
    }
    Vec_PtrFree(p);
  }
  pAbc->vPoEquivs = *pvPoEquivs;
  *pvPoEquivs = (Vec_Ptr_t *)0x0;
  return;
}

Assistant:

void Abc_FrameReplacePoEquivs( Abc_Frame_t * pAbc, Vec_Ptr_t ** pvPoEquivs )
{
    if ( pAbc->vPoEquivs )
        Vec_VecFree( (Vec_Vec_t *)pAbc->vPoEquivs );
    pAbc->vPoEquivs = *pvPoEquivs;
    *pvPoEquivs = NULL;
}